

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall phosg::Image::invert(Image *this)

{
  uint64_t uVar1;
  long lVar2;
  ssize_t x;
  long x_00;
  long y;
  long lVar3;
  uint64_t a;
  uint64_t b;
  uint64_t g;
  uint64_t r;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  y = 0;
  lVar3 = this->width;
  if (this->width < 1) {
    lVar3 = y;
  }
  lVar2 = this->height;
  if (this->height < 1) {
    lVar2 = y;
  }
  for (; y != lVar2; y = y + 1) {
    for (x_00 = 0; lVar3 != x_00; x_00 = x_00 + 1) {
      read_pixel(this,x_00,y,&local_38,&local_40,&local_48,&local_50);
      uVar1 = this->max_value;
      write_pixel(this,x_00,y,uVar1 - local_38,uVar1 - local_40,uVar1 - local_48,uVar1 - local_50);
    }
  }
  return;
}

Assistant:

void Image::invert() {
  ssize_t w = this->get_width();
  ssize_t h = this->get_height();
  for (ssize_t y = 0; y < h; y++) {
    for (ssize_t x = 0; x < w; x++) {
      uint64_t r, g, b, a;
      this->read_pixel(x, y, &r, &g, &b, &a);
      this->write_pixel(x, y, this->max_value - r, this->max_value - g, this->max_value - b, this->max_value - a);
    }
  }
}